

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O0

ReadResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::Read
          (CordRepBtreeNavigator *this,size_t edge_offset,size_t n)

{
  ReadResult RVar1;
  CordRep *pCVar2;
  CordRepBtree *pCVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *right;
  CordRepBtree *tree;
  size_t subtree_end;
  CordRepBtree *subtree;
  CordRep *edge;
  CordRepBtree *node;
  size_t index;
  size_t length;
  int height;
  size_t n_local;
  size_t edge_offset_local;
  CordRepBtreeNavigator *this_local;
  ulong local_10;
  
  length._4_4_ = 0;
  index = edge_offset + n;
  node = (CordRepBtree *)(ulong)this->index_[0];
  edge = &this->node_[0]->super_CordRep;
  subtree = (CordRepBtree *)CordRepBtree::Edge((CordRepBtree *)edge,(size_t)node);
  if ((subtree->super_CordRep).length <= edge_offset) {
    __assert_fail("edge_offset < edge->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x72,
                  "ReadResult absl::cord_internal::CordRepBtreeNavigator::Read(size_t, size_t)");
  }
  if (index < (subtree->super_CordRep).length) {
    this_local = (CordRepBtreeNavigator *)
                 anon_unknown_10::Substring((CordRep *)subtree,edge_offset,n);
    local_10 = index;
  }
  else {
    pCVar2 = anon_unknown_10::Substring((CordRep *)subtree,edge_offset);
    subtree_end = (size_t)CordRepBtree::New(pCVar2);
    tree = (CordRepBtree *)0x1;
    do {
      index = index - (subtree->super_CordRep).length;
      while( true ) {
        this_local = (CordRepBtreeNavigator *)subtree_end;
        node = (CordRepBtree *)((long)&(node->super_CordRep).length + 1);
        pCVar3 = (CordRepBtree *)CordRepBtree::end((CordRepBtree *)edge);
        if (node != pCVar3) break;
        this->index_[length._4_4_] = (uint8_t)node;
        length._4_4_ = length._4_4_ + 1;
        if (this->height_ < length._4_4_) {
          CordRepBtree::set_end((CordRepBtree *)subtree_end,(size_t)tree);
          if (index == 0) {
            local_10 = 0;
          }
          else {
            CordRep::Unref((CordRep *)subtree_end);
            this_local = (CordRepBtreeNavigator *)0x0;
            local_10 = index;
          }
          goto LAB_00906e54;
        }
        if (index != 0) {
          CordRepBtree::set_end((CordRepBtree *)subtree_end,(size_t)tree);
          subtree_end = (size_t)CordRepBtree::New((CordRep *)subtree_end);
          tree = (CordRepBtree *)0x1;
        }
        edge = &this->node_[length._4_4_]->super_CordRep;
        node = (CordRepBtree *)(ulong)this->index_[length._4_4_];
      }
      subtree = (CordRepBtree *)CordRepBtree::Edge((CordRepBtree *)edge,(size_t)node);
      if ((subtree->super_CordRep).length <= index) {
        *(size_t *)subtree_end = (subtree->super_CordRep).length + *(long *)subtree_end;
        pCVar2 = CordRep::Ref((CordRep *)subtree);
        *(CordRep **)(subtree_end + 0x10 + (long)tree * 8) = pCVar2;
        tree = (CordRepBtree *)((long)&(tree->super_CordRep).length + 1);
      }
    } while ((subtree->super_CordRep).length <= index);
    *(size_t *)subtree_end = index + *(long *)subtree_end;
    while (0 < length._4_4_) {
      pCVar3 = CordRep::btree(&subtree->super_CordRep);
      this->index_[length._4_4_] = (uint8_t)node;
      length._4_4_ = length._4_4_ + -1;
      this->node_[length._4_4_] = pCVar3;
      node = (CordRepBtree *)CordRepBtree::begin(pCVar3);
      subtree = (CordRepBtree *)CordRepBtree::Edge(pCVar3,(size_t)node);
      if (index != 0) {
        pCVar4 = CordRepBtree::New(length._4_4_);
        (pCVar4->super_CordRep).length = index;
        *(CordRepBtree **)(subtree_end + 0x10 + (long)tree * 8) = pCVar4;
        CordRepBtree::set_end
                  ((CordRepBtree *)subtree_end,(size_t)((long)&(tree->super_CordRep).length + 1));
        tree = (CordRepBtree *)0x0;
        while (subtree_end = (size_t)pCVar4, (subtree->super_CordRep).length <= index) {
          pCVar2 = CordRep::Ref(&subtree->super_CordRep);
          pCVar4->edges_[(long)tree] = pCVar2;
          index = index - (subtree->super_CordRep).length;
          node = (CordRepBtree *)((long)&(node->super_CordRep).length + 1);
          subtree = (CordRepBtree *)CordRepBtree::Edge(pCVar3,(size_t)node);
          tree = (CordRepBtree *)((long)&(tree->super_CordRep).length + 1);
        }
      }
    }
    if (index != 0) {
      pCVar2 = anon_unknown_10::Substring(&subtree->super_CordRep,0,index);
      *(CordRep **)(subtree_end + 0x10 + (long)tree * 8) = pCVar2;
      tree = (CordRepBtree *)((long)&(tree->super_CordRep).length + 1);
    }
    CordRepBtree::set_end((CordRepBtree *)subtree_end,(size_t)tree);
    this->index_[0] = (uint8_t)node;
    local_10 = index;
  }
LAB_00906e54:
  RVar1.n = local_10;
  RVar1.tree = (CordRep *)this_local;
  return RVar1;
}

Assistant:

ReadResult CordRepBtreeNavigator::Read(size_t edge_offset, size_t n) {
  int height = 0;
  size_t length = edge_offset + n;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);
  assert(edge_offset < edge->length);

  if (length < edge->length) {
    return {Substring(edge, edge_offset, n), length};
  }

  // Similar to 'Skip', we consume all edges that are inside the 'length' of
  // data that needs to be read. If we exhaust the current level, we move one
  // level up the tree and repeat until we hit the final edge that must be
  // (partially) read. We consume all edges into `subtree`.
  CordRepBtree* subtree = CordRepBtree::New(Substring(edge, edge_offset));
  size_t subtree_end = 1;
  do {
    length -= edge->length;
    while (++index == node->end()) {
      index_[height] = static_cast<uint8_t>(index);
      if (++height > height_) {
        subtree->set_end(subtree_end);
        if (length == 0) return {subtree, 0};
        CordRep::Unref(subtree);
        return {nullptr, length};
      }
      if (length != 0) {
        subtree->set_end(subtree_end);
        subtree = CordRepBtree::New(subtree);
        subtree_end = 1;
      }
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
    if (length >= edge->length) {
      subtree->length += edge->length;
      subtree->edges_[subtree_end++] = CordRep::Ref(edge);
    }
  } while (length >= edge->length);
  CordRepBtree* tree = subtree;
  subtree->length += length;

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be read, adding 'down' nodes to `subtree`.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);

    if (length != 0) {
      CordRepBtree* right = CordRepBtree::New(height);
      right->length = length;
      subtree->edges_[subtree_end++] = right;
      subtree->set_end(subtree_end);
      subtree = right;
      subtree_end = 0;
      while (length >= edge->length) {
        subtree->edges_[subtree_end++] = CordRep::Ref(edge);
        length -= edge->length;
        edge = node->Edge(++index);
      }
    }
  }
  // Add any (partial) edge still remaining at the leaf level.
  if (length != 0) {
    subtree->edges_[subtree_end++] = Substring(edge, 0, length);
  }
  subtree->set_end(subtree_end);
  index_[0] = static_cast<uint8_t>(index);
  return {tree, length};
}